

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(connectdata *conn,char *enclist,int maybechunked)

{
  byte bVar1;
  Curl_easy *pCVar2;
  int iVar3;
  contenc_writer *pcVar4;
  size_t sVar5;
  content_encoding **ppcVar6;
  size_t max;
  content_encoding *handler;
  byte *pbVar7;
  
  pCVar2 = conn->data;
  do {
    for (; (iVar3 = Curl_isspace((uint)(byte)*enclist), iVar3 != 0 || (*enclist == 0x2c));
        enclist = (char *)((byte *)enclist + 1)) {
    }
    sVar5 = 1;
    max = 0;
    for (pbVar7 = (byte *)enclist; (bVar1 = *pbVar7, bVar1 != 0 && (bVar1 != 0x2c));
        pbVar7 = pbVar7 + 1) {
      iVar3 = Curl_isspace((uint)bVar1);
      if (iVar3 == 0) {
        max = sVar5;
      }
      sVar5 = sVar5 + 1;
    }
    if (((maybechunked == 0) || (max != 7)) ||
       (iVar3 = Curl_strncasecompare(enclist,"chunked",7), iVar3 == 0)) {
      if (max != 0) {
        ppcVar6 = encodings;
        handler = &identity_encoding;
        do {
          ppcVar6 = ppcVar6 + 1;
          iVar3 = Curl_strncasecompare(enclist,handler->name,max);
          if (((iVar3 != 0) && (handler->name[max] == '\0')) ||
             ((handler->alias != (char *)0x0 &&
              ((iVar3 = Curl_strncasecompare(enclist,handler->alias,max), iVar3 != 0 &&
               (handler->alias[max] == '\0')))))) goto LAB_0012cf13;
          handler = *ppcVar6;
        } while (handler != (content_encoding *)0x0);
        handler = (content_encoding *)0x0;
LAB_0012cf13:
        if ((pCVar2->req).writer_stack == (contenc_writer_s *)0x0) {
          pcVar4 = new_unencoding_writer(conn,&client_encoding,(contenc_writer *)0x0);
          (pCVar2->req).writer_stack = pcVar4;
          if (pcVar4 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (handler == (content_encoding *)0x0) {
          handler = &error_encoding;
        }
        pcVar4 = new_unencoding_writer(conn,handler,(pCVar2->req).writer_stack);
        if (pcVar4 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pCVar2->req).writer_stack = pcVar4;
      }
    }
    else {
      (pCVar2->req).chunk = true;
      Curl_httpchunk_init(conn);
    }
    enclist = (char *)pbVar7;
    if (*pbVar7 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct connectdata *conn,
                                     const char *enclist, int maybechunked)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(conn);   /* init our chunky engine. */
    }
    else if(namelen) {
      const content_encoding *encoding = find_encoding(name, namelen);
      contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(conn, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(conn, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}